

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

ON__UINT32 __thiscall ON_MeshNgon::CRC32(ON_MeshNgon *this)

{
  ON__UINT32 OVar1;
  
  OVar1 = 0;
  if (((ulong)this->m_Vcount != 0) && (OVar1 = 0, this->m_vi != (uint *)0x0)) {
    OVar1 = ON_CRC32(0,(ulong)this->m_Vcount << 2,this->m_vi);
  }
  if (((ulong)this->m_Fcount != 0) && (this->m_fi != (uint *)0x0)) {
    OVar1 = ON_CRC32(OVar1,(ulong)this->m_Fcount << 2,this->m_fi);
    return OVar1;
  }
  return OVar1;
}

Assistant:

ON__UINT32 ON_MeshNgon::CRC32() const
{
  ON__UINT32 crc = 0;
  if ( m_Vcount > 0 && m_vi )
    crc = ON_CRC32(crc,m_Vcount*sizeof(m_vi[0]),m_vi);  
  if ( m_Fcount > 0 && m_fi )
    crc = ON_CRC32(crc,m_Fcount*sizeof(m_fi[0]),m_fi);
  return crc;
}